

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

span<const_slang::ast::Expression_*const,_18446744073709551615UL> __thiscall
slang::ast::NetAliasSymbol::getNetReferences(NetAliasSymbol *this)

{
  SyntaxNode *pSVar1;
  Type *this_00;
  pointer pNVar2;
  size_type sVar3;
  DriverBitRange secondRange;
  bool bVar4;
  int iVar5;
  bitwidth_t bVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  undefined4 extraout_var;
  Diagnostic *this_02;
  pointer ppEVar8;
  undefined8 *puVar9;
  Compilation *pCVar10;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  Compilation *pCVar11;
  Expression *pEVar12;
  Scope *pSVar13;
  pointer pNVar14;
  unsigned_long uVar15;
  ulong uVar16;
  pointer pNVar17;
  unsigned_long uVar18;
  long lVar19;
  undefined8 *puVar20;
  long lVar21;
  __extent_storage<18446744073709551615UL> _Var22;
  Expression *pEVar23;
  Compilation *pCVar24;
  LookupLocation LVar25;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar26;
  DriverBitRange firstRange;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  NetAliasVisitor visitor;
  ASTContext context;
  SmallVector<slang::SmallVector<slang::ast::NetAlias,_2UL>,_2UL> netAliases;
  EvalContext evalCtx;
  uint local_5a4;
  Expression *local_5a0;
  NetAliasSymbol *local_598;
  Scope *local_590;
  Compilation *local_588;
  Compilation *local_580;
  Compilation *local_578;
  long local_570;
  Compilation *local_568;
  Compilation *local_560;
  undefined8 *local_558;
  unsigned_long local_550;
  unsigned_long uStack_548;
  SmallVectorBase<const_slang::ast::Expression_*> local_540 [2];
  NetAliasVisitor local_500;
  ASTContext local_488;
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> local_450;
  EvalContext local_388;
  Expression *this_01;
  undefined4 extraout_var_00;
  
  if ((this->netRefs).
      super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ._M_engaged == true) {
    ppEVar8 = (this->netRefs).
              super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ._M_payload._M_value._M_ptr;
    _Var22._M_extent_value =
         (this->netRefs).
         super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
         ._M_payload._M_value._M_extent._M_extent_value;
  }
  else {
    pSVar13 = (this->super_Symbol).parentScope;
    pSVar1 = (this->super_Symbol).originatingSyntax;
    local_540[0].data_ = (pointer)local_540[0].firstElement;
    local_540[0].len = 0;
    local_540[0].cap = 5;
    LVar25 = LookupLocation::after(&this->super_Symbol);
    local_500.context = &local_488;
    local_488.lookupIndex = LVar25.index;
    local_488.flags.m_bits = 0x100000020;
    local_488.randomizeDetails = (RandomizeDetails *)0x0;
    local_488.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_488.instanceOrProc = (Symbol *)0x0;
    local_488.firstTempVar = (TempVarSymbol *)0x0;
    local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
         (pointer)local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement
    ;
    local_388.astCtx.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_388.astCtx.firstTempVar = (TempVarSymbol *)0x0;
    local_388.astCtx.randomizeDetails = (RandomizeDetails *)0x0;
    local_388.astCtx.flags.m_bits = 0x100000020;
    local_388.astCtx.instanceOrProc = (Symbol *)0x0;
    local_388.astCtx._12_4_ = local_488._12_4_;
    pEVar23 = (Expression *)0x0;
    local_388.flags.m_bits = '\0';
    local_388._60_8_ = 0;
    local_388._68_8_ = 0;
    local_388.queueTarget._4_4_ = 0;
    local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
    local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
    local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
         (pointer)local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
    local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
    local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
    local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    local_388.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    local_388.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_388.backtraceReported = false;
    local_388.disableRange.startLoc = (SourceLocation)0x0;
    local_388.disableRange.endLoc = (SourceLocation)0x0;
    src = (EVP_PKEY_CTX *)
          local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.firstElement;
    local_500.commonNetType = (NetType *)0x0;
    local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.len = 0;
    local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.cap = 2;
    local_500.evalCtx = &local_388;
    local_500.issuedError = false;
    local_450.data_ = (pointer)local_450.firstElement;
    local_450.len = 0;
    local_450.cap = 2;
    uVar15 = *(long *)(pSVar1 + 6) + 1;
    pEVar12 = pEVar23;
    local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.data_ = (pointer)src;
    local_488.scope.ptr = pSVar13;
    local_388.astCtx.scope.ptr = pSVar13;
    local_388.astCtx.lookupIndex = local_488.lookupIndex;
    if (1 < uVar15) {
      uVar16 = uVar15 >> 1;
      lVar21 = 0;
      pEVar12 = (Expression *)0x0;
      local_598 = this;
      local_590 = pSVar13;
      do {
        ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(pSVar1[5].previewNode)->kind + lVar21));
        iVar5 = Expression::bind((int)*ppSVar7,(sockaddr *)&local_488,0);
        this_01 = (Expression *)CONCAT44(extraout_var,iVar5);
        bVar4 = Expression::requireLValue
                          (this_01,&local_488,(SourceLocation)0x0,
                           (bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0);
        src = extraout_RDX;
        if (bVar4) {
          this_00 = (this_01->type).ptr;
          if ((bitwidth_t)pEVar23 == 0) {
            bVar6 = Type::getBitWidth(this_00);
            pEVar23 = (Expression *)(ulong)bVar6;
          }
          else {
            bVar6 = Type::getBitWidth(this_00);
            if (((bitwidth_t)pEVar23 != bVar6) && (pEVar12 == (Expression *)0x0)) {
              this_02 = ASTContext::addDiag(&local_488,(DiagCode)0x890006,this_01->sourceRange);
              bVar6 = Type::getBitWidth((this_01->type).ptr);
              local_5a0 = (Expression *)(ulong)bVar6;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&this_02->args,(unsigned_long *)&local_5a0);
              local_5a0 = pEVar23;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&this_02->args,(unsigned_long *)&local_5a0);
              pEVar12 = (Expression *)0x1;
            }
          }
          Expression::visitExpression<slang::ast::Expression_const,slang::ast::NetAliasVisitor&>
                    (this_01,this_01,&local_500);
          local_5a0 = this_01;
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_540,&local_5a0);
          src = extraout_RDX_00;
          if (local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.len != 0) {
            SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
            emplace_back<slang::SmallVector<slang::ast::NetAlias,2ul>>
                      ((SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>> *)&local_450,
                       &local_500.netAliases);
            local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.len = 0;
            src = extraout_RDX_01;
          }
        }
        lVar21 = lVar21 + 0x30;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
      uVar15 = 0;
      pSVar13 = local_590;
      this = local_598;
    }
    pCVar11 = pSVar13->compilation;
    iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_540,(EVP_PKEY_CTX *)pCVar11,src);
    ppEVar8 = (pointer)CONCAT44(extraout_var_00,iVar5);
    if ((this->netRefs).
        super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ._M_engaged == false) {
      (this->netRefs).
      super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ._M_engaged = true;
    }
    (this->netRefs).
    super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ._M_payload._M_value._M_ptr = ppEVar8;
    (this->netRefs).
    super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ._M_payload._M_value._M_extent._M_extent_value = extraout_RDX_02;
    _Var22._M_extent_value = extraout_RDX_02;
    if (((pEVar12 == (Expression *)0x0) && ((Compilation *)local_450.len != (Compilation *)0x0)) &&
       (local_588 = (Compilation *)
                    ((long)&((Compilation *)(local_450.len + -0xc58))->defaultLibPtr + 7),
       local_588 != (Compilation *)0x0)) {
      pCVar10 = pSVar13->compilation;
      local_580 = (Compilation *)0x0;
      local_5a4 = (uint)pCVar10;
      local_578 = (Compilation *)local_450.len;
      local_598 = this;
      local_590 = pSVar13;
      local_560 = pCVar10;
      do {
        local_570 = (long)local_580 * 0x58;
        pCVar11 = (Compilation *)((long)&(local_580->super_BumpAllocator).head + 1);
        local_580 = pCVar11;
        do {
          puVar9 = *(undefined8 **)
                    (((local_450.data_)->super_SmallVectorBase<slang::ast::NetAlias>).firstElement +
                    local_570 + -0x18);
          local_558 = puVar9 + *(long *)(((local_450.data_)->
                                         super_SmallVectorBase<slang::ast::NetAlias>).firstElement +
                                        local_570 + -0x10) * 4;
          pNVar2 = local_450.data_[(long)pCVar11].super_SmallVectorBase<slang::ast::NetAlias>.data_;
          sVar3 = local_450.data_[(long)pCVar11].super_SmallVectorBase<slang::ast::NetAlias>.len;
          bVar4 = false;
          pNVar17 = pNVar2;
          local_568 = pCVar11;
          while ((puVar9 != local_558 && (pNVar17 != pNVar2 + sVar3))) {
            pCVar11 = (Compilation *)puVar9[2];
            uVar18 = puVar9[3];
            pCVar24 = (Compilation *)(pNVar17->bounds).first;
            uStack_548 = (pNVar17->bounds).second;
            if (bVar4) {
              if ((local_5a4 & 1) == 0) {
                bVar4 = false;
                uStack_548 = uVar15;
                pCVar24 = pCVar10;
              }
              else {
                bVar4 = false;
                pCVar11 = pCVar10;
                uVar18 = uVar15;
              }
            }
            lVar19 = uVar18 - (long)pCVar11;
            lVar21 = uStack_548 - (long)pCVar24;
            if (lVar19 + 1U < lVar21 + 1U) {
              uVar15 = uStack_548 - (lVar19 + 1U);
              if (!bVar4) {
                bVar4 = true;
              }
              local_5a4 = 0;
              pNVar14 = pNVar17;
              lVar21 = lVar19;
              puVar20 = puVar9 + 4;
              pCVar10 = pCVar24;
            }
            else {
              pNVar14 = pNVar17 + 1;
              if (lVar19 == lVar21) {
                lVar21 = lVar19;
                puVar20 = puVar9 + 4;
              }
              else {
                uVar15 = uVar18 - (lVar21 + 1U);
                if (!bVar4) {
                  bVar4 = true;
                }
                local_5a4 = 1;
                puVar20 = puVar9;
                pCVar10 = pCVar11;
              }
            }
            firstRange.first = uVar18 - lVar21;
            local_550 = uStack_548 - lVar21;
            secondRange.second = uStack_548;
            secondRange.first = local_550;
            firstRange.second = uVar18;
            Compilation::noteNetAlias
                      (local_560,local_590,(Symbol *)*puVar9,firstRange,(Expression *)puVar9[1],
                       &((pNVar17->sym).ptr)->super_Symbol,secondRange,(pNVar17->expr).ptr);
            puVar9 = puVar20;
            pNVar17 = pNVar14;
          }
          pCVar11 = (Compilation *)((long)&(local_568->super_BumpAllocator).head + 1);
        } while (pCVar11 < local_578);
      } while (local_580 != local_588);
      ppEVar8 = (local_598->netRefs).
                super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ._M_payload._M_value._M_ptr;
      _Var22._M_extent_value =
           (local_598->netRefs).
           super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
           ._M_payload._M_value._M_extent._M_extent_value;
    }
    SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::cleanup
              (&local_450,(EVP_PKEY_CTX *)pCVar11);
    if (local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.data_ !=
        (pointer)local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.firstElement) {
      operator_delete(local_500.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.data_);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&local_388.warnings,(EVP_PKEY_CTX *)pCVar11);
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&local_388.diags,(EVP_PKEY_CTX *)pCVar11);
    if (local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ !=
        (pointer)local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement) {
      operator_delete(local_388.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
    }
    SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
              (&local_388.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,
               (EVP_PKEY_CTX *)pCVar11);
    if (local_540[0].data_ != (pointer)local_540[0].firstElement) {
      operator_delete(local_540[0].data_);
    }
  }
  sVar26._M_extent._M_extent_value = _Var22._M_extent_value;
  sVar26._M_ptr = ppEVar8;
  return sVar26;
}

Assistant:

std::span<const Expression* const> NetAliasSymbol::getNetReferences() const {
    if (netRefs)
        return *netRefs;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    SmallVector<const Expression*> buffer;
    ASTContext context(*scope, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::NotADriver);
    EvalContext evalCtx(context);
    NetAliasVisitor visitor(context, evalCtx);
    SmallVector<SmallVector<NetAlias>> netAliases;
    bitwidth_t bitWidth = 0;
    bool issuedError = false;

    for (auto exprSyntax : syntax->as<NetAliasSyntax>().nets) {
        auto& netRef = Expression::bind(*exprSyntax, context);
        if (!netRef.requireLValue(context))
            continue;

        if (!bitWidth) {
            bitWidth = netRef.type->getBitWidth();
        }
        else if (bitWidth != netRef.type->getBitWidth() && !issuedError) {
            auto& diag = context.addDiag(diag::NetAliasWidthMismatch, netRef.sourceRange);
            diag << netRef.type->getBitWidth() << bitWidth;
            issuedError = true;
        }

        netRef.visit(visitor);
        buffer.push_back(&netRef);
        if (!visitor.netAliases.empty()) {
            netAliases.emplace_back(std::move(visitor.netAliases));
            visitor.netAliases.clear();
        }
    }

    netRefs = buffer.copy(scope->getCompilation());
    if (issuedError || netAliases.empty())
        return *netRefs;

    // Compare every net alias expression to every other, finding the set of
    // bits that overlap and adding drivers for them so that we can catch
    // and report on duplicate and/or self aliases.
    auto& comp = scope->getCompilation();
    const size_t numAliases = netAliases.size();
    for (size_t i = 0; i < numAliases - 1; i++) {
        for (size_t j = i + 1; j < numAliases; j++) {
            auto& first = netAliases[i];
            auto& second = netAliases[j];
            auto firstIt = first.begin();
            auto firstEnd = first.end();
            auto secondIt = second.begin();
            auto secondEnd = second.end();

            // Compare each net reference or selection from the left hand side
            // to the corresponding elements on the right hand side. The individual
            // elements can differ in width, so consume bits from the larger side
            // and only advance when a side has been consumed.
            std::optional<std::pair<DriverBitRange, bool>> remainder;
            while (firstIt != firstEnd && secondIt != secondEnd) {
                auto& firstAlias = *firstIt;
                auto& secondAlias = *secondIt;
                auto firstRange = firstAlias.bounds;
                auto secondRange = secondAlias.bounds;

                if (remainder) {
                    if (remainder->second)
                        firstRange = remainder->first;
                    else
                        secondRange = remainder->first;
                    remainder.reset();
                }

                auto firstWidth = firstRange.second - firstRange.first + 1;
                auto secondWidth = secondRange.second - secondRange.first + 1;

                uint64_t width;
                if (firstWidth < secondWidth) {
                    width = firstWidth;
                    remainder = std::pair(
                        DriverBitRange(secondRange.first, secondRange.second - width), false);
                    firstIt++;
                }
                else {
                    width = secondWidth;
                    secondIt++;

                    if (firstWidth == secondWidth)
                        firstIt++;
                    else {
                        remainder = std::pair(
                            DriverBitRange(firstRange.first, firstRange.second - width), true);
                    }
                }

                comp.noteNetAlias(*scope, *firstAlias.sym,
                                  {firstRange.second - width + 1, firstRange.second},
                                  *firstAlias.expr, *secondAlias.sym,
                                  {secondRange.second - width + 1, secondRange.second},
                                  *secondAlias.expr);
            }
        }
    }

    return *netRefs;
}